

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void dequantize_row_iq2_xxs(block_iq2_xxs *x,float *y,int64_t k)

{
  float *pfVar1;
  float fVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  undefined1 auVar9 [13];
  long lVar10;
  long lVar11;
  long lVar12;
  int ib32;
  long lVar13;
  int l;
  long lVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  char cVar21;
  char cVar27;
  uint uVar22;
  char cVar25;
  char cVar26;
  uint uVar28;
  undefined1 auVar24 [16];
  undefined8 local_30;
  uint32_t aux32 [2];
  undefined1 auVar23 [12];
  
  lVar10 = k + 0xff;
  if (-1 < k) {
    lVar10 = k;
  }
  if (0xff < k) {
    lVar11 = 0;
    do {
      fVar2 = ggml_table_f32_f16[x[lVar11].d];
      lVar13 = 0;
      do {
        local_30 = *(undefined8 *)(x[lVar11].qs + lVar13 * 4);
        local_30._4_4_ = (uint)((ulong)*(undefined8 *)(x[lVar11].qs + lVar13 * 4) >> 0x20);
        fVar15 = ((float)(local_30._4_4_ >> 0x1c) + 0.5) * fVar2 * 0.25;
        lVar14 = 0;
        do {
          bVar3 = *(byte *)((long)&local_30 + lVar14);
          auVar16 = ZEXT216(CONCAT11(""[local_30._4_4_ >> ((char)lVar14 * '\a' & 0x1fU) & 0x7f],
                                     ""[local_30._4_4_ >> ((char)lVar14 * '\a' & 0x1fU) & 0x7f]));
          auVar16 = pshuflw(auVar16,auVar16,0);
          lVar12 = 0;
          do {
            uVar4 = *(undefined4 *)((long)iq2xxs_grid + lVar12 + (ulong)bVar3 * 8);
            uVar8 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
            auVar5._8_4_ = 0;
            auVar5._0_8_ = uVar8;
            auVar5[0xc] = (char)((uint)uVar4 >> 0x18);
            auVar6[8] = (char)((uint)uVar4 >> 0x10);
            auVar6._0_8_ = uVar8;
            auVar6[9] = 0;
            auVar6._10_3_ = auVar5._10_3_;
            auVar9._5_8_ = 0;
            auVar9._0_5_ = auVar6._8_5_;
            auVar7[4] = (char)((uint)uVar4 >> 8);
            auVar7._0_4_ = (int)uVar8;
            auVar7[5] = 0;
            auVar7._6_7_ = SUB137(auVar9 << 0x40,6);
            fVar17 = (float)(int)uVar8 * fVar15;
            fVar18 = (float)auVar7._4_4_ * fVar15;
            fVar19 = (float)auVar6._8_4_ * fVar15;
            fVar20 = (float)(uint3)(auVar5._10_3_ >> 0x10) * fVar15;
            auVar24 = ZEXT416(*(uint *)(kmask_iq2xs + lVar12)) & auVar16;
            cVar27 = auVar24[3];
            cVar26 = auVar24[2];
            cVar25 = auVar24[1];
            cVar21 = auVar24[0];
            uVar22 = CONCAT13(-(cVar21 == '\0'),
                              CONCAT12(-(cVar21 == '\0'),
                                       CONCAT11(-(cVar21 == '\0'),-(cVar21 == '\0'))));
            auVar23._0_8_ =
                 CONCAT17(-(cVar25 == '\0'),
                          CONCAT16(-(cVar25 == '\0'),
                                   CONCAT15(-(cVar25 == '\0'),CONCAT14(-(cVar25 == '\0'),uVar22))));
            auVar23[8] = -(cVar26 == '\0');
            auVar23[9] = -(cVar26 == '\0');
            auVar23[10] = -(cVar26 == '\0');
            auVar23[0xb] = -(cVar26 == '\0');
            auVar24[0xc] = -(cVar27 == '\0');
            auVar24._0_12_ = auVar23;
            auVar24[0xd] = -(cVar27 == '\0');
            auVar24[0xe] = -(cVar27 == '\0');
            auVar24[0xf] = -(cVar27 == '\0');
            uVar28 = (uint)((ulong)auVar23._0_8_ >> 0x20);
            pfVar1 = y + lVar12;
            *pfVar1 = (float)(~uVar22 & (uint)-fVar17 | (uint)fVar17 & uVar22);
            pfVar1[1] = (float)(~uVar28 & (uint)-fVar18 | (uint)fVar18 & uVar28);
            pfVar1[2] = (float)(~auVar23._8_4_ & (uint)-fVar19 | (uint)fVar19 & auVar23._8_4_);
            pfVar1[3] = (float)(~auVar24._12_4_ & (uint)-fVar20 | (uint)fVar20 & auVar24._12_4_);
            lVar12 = lVar12 + 4;
          } while (lVar12 != 8);
          y = y + 8;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 8);
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar10 >> 8);
  }
  return;
}

Assistant:

void dequantize_row_iq2_xxs(const block_iq2_xxs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    uint32_t aux32[2];
    const uint8_t * aux8 = (const uint8_t *)aux32;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            memcpy(aux32, x[i].qs + 4*ib32, 2*sizeof(uint32_t));
            const float db = d * (0.5f + (aux32[1] >> 28)) * 0.25f;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2xxs_grid + aux8[l]);
                const uint8_t  signs = ksigns_iq2xs[(aux32[1] >> 7*l) & 127];
                for (int j = 0; j < 8; ++j) {
                    y[j] = db * grid[j] * (signs & kmask_iq2xs[j] ? -1.f : 1.f);
                }
                y += 8;
            }
        }
    }
}